

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddVerify.cpp
# Opt level: O2

void AddVerifyBase<long,int>(char *types)

{
  bool bVar1;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  uint uVar2;
  pointer t;
  bool bVar3;
  TestCase<long,_int,_3> TVar4;
  allocator local_c1;
  char *local_c0;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  TestVector<long,_int,_3> tests;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long ret;
  
  tests.test_cases = (TestCase<long,_int,_3> *)0x0;
  tests.count = 0;
  tests.current = 0;
  local_c0 = types;
  TVar4 = TestVector<long,_int,_3>::GetNext(&tests);
  while (t = (pointer)TVar4.x, tests.current < tests.count) {
    rhs.m_int = TVar4.y;
    bVar1 = SafeAdd<long,int>((long)t,rhs.m_int,&ret);
    bVar3 = TVar4.fExpected;
    if (bVar3 != bVar1) {
      std::__cxx11::string::string((string *)&local_58,"Error in case ",&local_c1);
      std::operator+(&local_98,&local_58,local_c0);
      std::operator+(&msg,&local_98,": ");
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::string((string *)&local_98,msg._M_dataplus._M_p,(allocator *)&local_58);
      err_msg<long,int>(&local_98,(long)t,rhs.m_int,(bool)(bVar3 & 1));
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p = t;
    SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
              ((SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&msg,rhs.m_int);
    uVar2 = TVar4._12_4_ & 0xff;
    if (uVar2 != 1) {
      std::__cxx11::string::string((string *)&local_58,"Error in case ",&local_c1);
      std::operator+(&local_98,&local_58,local_c0);
      std::operator+(&msg,&local_98," throw (1): ");
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::string((string *)&local_98,msg._M_dataplus._M_p,(allocator *)&local_58);
      err_msg<long,int>(&local_98,(long)t,rhs.m_int,(bool)(bVar3 & 1));
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p = t;
    operator+=((long *)&msg,rhs);
    if (uVar2 != 1) {
      std::__cxx11::string::string((string *)&local_58,"Error in case ",&local_c1);
      std::operator+(&local_98,&local_58,local_c0);
      std::operator+(&msg,&local_98," throw (2): ");
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::string((string *)&local_98,msg._M_dataplus._M_p,(allocator *)&local_58);
      err_msg<long,int>(&local_98,(long)t,rhs.m_int,(bool)(bVar3 & 1));
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&msg);
    }
    TVar4 = TestVector<long,_int,_3>::GetNext(&tests);
  }
  return;
}

Assistant:

void AddVerifyBase(const char* types)
{
	TestVector< T, U, OpType::Add > tests;
	TestCase< T, U, OpType::Add > test = tests.GetNext();

	while (!tests.Done())
	{
		T ret;
		if (SafeAdd(test.x, test.y, ret) != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + ": ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Now test throwing version
		bool fSuccess = true;
		try
		{
			SafeInt<T> si(test.x);
			si += test.y;
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (1): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Also need to test the version that assigns back out
		// to a plain int, as it has different logic
		fSuccess = true;
		try
		{
			T x(test.x);
			x += SafeInt<U>(test.y);
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (2): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		test = tests.GetNext();
	}
}